

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators_example.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  pointer pcVar3;
  __node_base _Var4;
  initializer_list<char> __l;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  int local_d8 [2];
  vector<char,_std::allocator<char>_> my_chars;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  copy_of_pair;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_90;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  name_to_id;
  
  copy_of_pair.first._M_dataplus._M_p._0_4_ = 0x64636261;
  copy_of_pair.first._M_dataplus._M_p._4_1_ = 0x65;
  __l._M_len = 5;
  __l._M_array = (iterator)&copy_of_pair;
  std::vector<char,_std::allocator<char>_>::vector(&my_chars,__l,(allocator_type *)&name_to_id);
  pcVar3 = my_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  std::operator<<((ostream *)&std::cout,"Print out the vector:\n");
  for (; pcVar3 != my_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,*pcVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  *my_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = 'x';
  std::operator<<((ostream *)&std::cout,"Print out the vector:\n");
  for (pcVar3 = my_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar3 != my_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,*pcVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  local_d8[1] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[7],_int,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&copy_of_pair,(char (*) [7])"victor",local_d8 + 1);
  local_d8[0] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_90,(char (*) [5])"john",local_d8);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,int>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&name_to_id,&copy_of_pair,&name_to_id,0,&local_d9,&local_da,&local_db);
  lVar2 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&copy_of_pair.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  for (_Var4 = name_to_id._M_h._M_before_begin; _Var4._M_nxt != (_Hash_node_base *)0x0;
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Key=");
    poVar1 = std::operator<<(poVar1,(string *)(_Var4._M_nxt + 1));
    poVar1 = std::operator<<(poVar1," Value=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&_Var4._M_nxt[5]._M_nxt);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
              (&copy_of_pair,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)(_Var4._M_nxt + 1));
    poVar1 = std::operator<<((ostream *)&std::cout,"Copied Key=");
    poVar1 = std::operator<<(poVar1,(string *)&copy_of_pair);
    poVar1 = std::operator<<(poVar1," Copied Value=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,copy_of_pair.second);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&copy_of_pair);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&name_to_id._M_h);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&my_chars.super__Vector_base<char,_std::allocator<char>_>);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Let's create a vector and iterate it using iterators.
  // Note that we are initializing the vector from an initialization list.
  std::vector<char> my_chars = {'a', 'b', 'c', 'd', 'e'};
  // Iterators are objects that allow the user to iterate a c++ collection.
  // These collections can be vectors, maps, sets, and others. Iterators
  // behave like points. That is that they can be incremented, decremented, and
  // dereferenced to access the content. This binary will give an example using
  // a vector and an unordered_map.
  // To get an iterator at the beginning of the collection, we call the method
  // begin(). If we desire to get an iterator at the end, we simply call the
  // method end(). The end of a collection does not point to the last entry. It
  // points to the subsequent entry where new data can be stored.
  // Iterators can be compared, for instance, the iterators begin() <= end(), or
  // begin() != end().
  // Note that the iterators require to know the collection and the type it
  // holds.
  std::vector<char>::iterator iterator = my_chars.begin();
  std::vector<char>::iterator ending_iterator = my_chars.end();
  // The for loop will use the iterator that points at the beginning of the
  // vector to access the elements in it.
  std::cout << "Print out the vector:\n";
  for (; iterator != ending_iterator; ++iterator) {
    // To acccess the value of an iterator, we use the dereference operator
    // as if the iterator was a pointer.
    std::cout << *iterator << std::endl;
  }
  // Since iterators act like points, we can change the value of entries.
  // For instance, to change the value of the first entry.
  iterator = my_chars.begin();
  *iterator = 'x';
  // The for loop will use the iterator that points at the beginning of the
  // vector to access the elements in it.
  std::cout << "Print out the vector:\n";
  for (; iterator != ending_iterator; ++iterator) {
    // To acccess the value of an iterator, we use the dereference operator
    // as if the iterator was a pointer.
    std::cout << *iterator << std::endl;
  }

  // Let's create a map and iterate it using iterators.
  std::unordered_map<std::string, int> name_to_id =
      {{"victor", 1}, {"john", 2}};
  // Let's define an iterator for this map. Remember that the iterators must
  // know the structure and the type they point to.
  std::unordered_map<std::string, int>::iterator map_iterator;
  // Let map_iterator point to the begining of the map.
  map_iterator = name_to_id.begin();
  for (; map_iterator != name_to_id.end(); ++map_iterator) {
    // Remember that the internal structure of a map is an std::pair. Recall
    // that std::pair has two members: first and second. Since iterator acts
    // like a pointer we need to use the '->' operator to access the members
    // of the pair. For instance:
    std::cout << "Key=" << map_iterator->first
              << " Value=" << map_iterator->second
              << std::endl;
    // To clarify this, let's make a copy of the pointer pair. To make the copy
    // we declare a pair with the same data type for its members. Then, we
    // dereference the iterator to access the pointed value.
    std::pair<std::string, int> copy_of_pair = *map_iterator;
    std::cout << "Copied Key=" << copy_of_pair.first
              << " Copied Value=" << copy_of_pair.second
              << std::endl;
  }
  return 0;
}